

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

RGB pbrt::Clamp<int,int>(RGB *rgb,int min,int max)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  RGB RVar12;
  
  auVar9._0_4_ = (float)min;
  auVar9._4_12_ = in_ZMM0._4_12_;
  auVar8._0_4_ = (float)max;
  auVar8._4_12_ = in_ZMM0._4_12_;
  uVar1 = rgb->r;
  uVar2 = rgb->g;
  auVar7._4_4_ = uVar2;
  auVar7._0_4_ = uVar1;
  auVar7._8_8_ = 0;
  auVar10._4_4_ = auVar9._0_4_;
  auVar10._0_4_ = auVar9._0_4_;
  auVar10._8_4_ = auVar9._0_4_;
  auVar10._12_4_ = auVar9._0_4_;
  auVar11._4_4_ = auVar8._0_4_;
  auVar11._0_4_ = auVar8._0_4_;
  auVar11._8_4_ = auVar8._0_4_;
  auVar11._12_4_ = auVar8._0_4_;
  uVar5 = vcmpps_avx512vl(auVar7,auVar10,1);
  auVar7 = vminps_avx(auVar11,auVar7);
  bVar3 = (bool)((byte)uVar5 & 1);
  bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
  RVar12.g = (Float)((uint)bVar4 * (int)auVar9._0_4_ | (uint)!bVar4 * auVar7._4_4_);
  RVar12.r = (Float)((uint)bVar3 * (int)auVar9._0_4_ | (uint)!bVar3 * auVar7._0_4_);
  auVar7 = vminss_avx(auVar8,ZEXT416((uint)rgb->b));
  uVar6 = vcmpss_avx512f(ZEXT416((uint)rgb->b),auVar9,1);
  bVar3 = (bool)((byte)uVar6 & 1);
  RVar12.b = (Float)((uint)bVar3 * (int)auVar9._0_4_ + (uint)!bVar3 * auVar7._0_4_);
  return RVar12;
}

Assistant:

PBRT_CPU_GPU inline constexpr T Clamp(T val, U low, V high) {
    if (val < low)
        return low;
    else if (val > high)
        return high;
    else
        return val;
}